

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O0

double __thiscall Graph::getSum(Graph *this)

{
  double dVar1;
  Matrix local_118;
  double local_18;
  double d;
  Graph *this_local;
  
  d = (double)this;
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_118,&this->super_Matrix,1);
  dVar1 = Matrix::getSum(&local_118);
  Matrix::~Matrix(&local_118);
  local_18 = dVar1;
  Matrix::transpose(&this->super_Matrix);
  return local_18;
}

Assistant:

virtual double getSum() {
		transpose();
		double d = operator[](1).getSum();
		transpose();
		return d;
	}